

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_strategy.cpp
# Opt level: O1

vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
* __thiscall
license::hw_identifier::DiskStrategy::alternative_ids
          (vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
           *__return_storage_ptr__,DiskStrategy *this)

{
  undefined4 uVar1;
  pointer paVar2;
  FUNCTION_RETURN FVar3;
  LCC_API_HW_IDENTIFICATION_STRATEGY strategy;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  pointer data_00;
  bool bVar7;
  array<unsigned_char,_7UL> a_disk_id;
  vector<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_> data;
  vector<DiskInfo,_std::allocator<DiskInfo>_> disk_infos;
  array<unsigned_char,_7UL> local_88;
  array<unsigned_char,_7UL> local_80;
  vector<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_> local_78;
  vector<DiskInfo,_std::allocator<DiskInfo>_> local_58;
  DiskStrategy *local_40;
  vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
  *local_38;
  
  local_78.
  super__Vector_base<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (array<unsigned_char,_7UL> *)0x0;
  local_78.
  super__Vector_base<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (array<unsigned_char,_7UL> *)0x0;
  local_78.
  super__Vector_base<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (array<unsigned_char,_7UL> *)0x0;
  local_58.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_58.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  FVar3 = getDiskInfos(&local_58);
  if ((FVar3 == FUNC_RET_OK) &&
     ((long)local_58.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_58.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.
            super__Vector_impl_data._M_start != 0)) {
    std::vector<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>::
    reserve(&local_78,
            ((long)local_58.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_58.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.
                   super__Vector_impl_data._M_start >> 4) * 0x587e6b74f0329162);
    uVar4 = 0;
    local_40 = this;
    local_38 = __return_storage_ptr__;
    do {
      if (local_58.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_58.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.
          super__Vector_impl_data._M_start) {
        lVar5 = 0;
        uVar6 = 0;
        do {
          if ((((bool *)((long)local_58.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>.
                               _M_impl.super__Vector_impl_data._M_start + 0x50d))[lVar5] ^ uVar4) ==
              1) {
            if (((bool *)((long)local_58.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>.
                                _M_impl.super__Vector_impl_data._M_start + 0x40c))[lVar5] == true) {
              local_88._M_elems._4_2_ =
                   *(undefined2 *)
                    ((uchar *)((long)local_58.
                                     super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl
                                     .super__Vector_impl_data._M_start + 0x408) + lVar5);
              local_88._M_elems[6] =
                   ((uchar *)
                   ((long)local_58.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.
                          super__Vector_impl_data._M_start + 0x40a))[lVar5];
              local_88._M_elems._0_4_ =
                   *(undefined4 *)
                    ((uchar *)((long)local_58.
                                     super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl
                                     .super__Vector_impl_data._M_start + 0x404) + lVar5);
              if (local_78.
                  super__Vector_base<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  local_78.
                  super__Vector_base<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<std::array<unsigned_char,7ul>,std::allocator<std::array<unsigned_char,7ul>>>
                ::_M_realloc_insert<std::array<unsigned_char,7ul>const&>
                          ((vector<std::array<unsigned_char,7ul>,std::allocator<std::array<unsigned_char,7ul>>>
                            *)&local_78,
                           (iterator)
                           local_78.
                           super__Vector_base<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_88);
              }
              else {
                *(uint *)((local_78.
                           super__Vector_base<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->_M_elems + 3) =
                     CONCAT13(local_88._M_elems[6],
                              CONCAT21(local_88._M_elems._4_2_,local_88._M_elems[3]));
                *(undefined4 *)
                 (local_78.
                  super__Vector_base<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->_M_elems = local_88._M_elems._0_4_;
                local_78.
                super__Vector_base<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_78.
                     super__Vector_base<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
              }
            }
            if (((bool *)((long)local_58.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>.
                                _M_impl.super__Vector_impl_data._M_start + 0x50c))[lVar5] == true) {
              local_88._M_elems[4] = '\0';
              local_88._M_elems[5] = '\0';
              local_88._M_elems[6] = '\0';
              local_88._M_elems[0] = '\0';
              local_88._M_elems[1] = '\0';
              local_88._M_elems[2] = '\0';
              local_88._M_elems[3] = '\0';
              strncpy((char *)&local_88,
                      (char *)((long)local_58.
                                     super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl
                                     .super__Vector_impl_data._M_start + lVar5 + 0x40d),6);
              local_80._M_elems[0] = local_88._M_elems[0];
              local_80._M_elems[1] = local_88._M_elems[1];
              local_80._M_elems[2] = local_88._M_elems[2];
              local_80._M_elems[3] = local_88._M_elems[3];
              uVar1 = local_80._M_elems._0_4_;
              local_80._M_elems[6] = local_88._M_elems[6];
              local_80._M_elems[4] = local_88._M_elems[4];
              local_80._M_elems[5] = local_88._M_elems[5];
              if (local_78.
                  super__Vector_base<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  local_78.
                  super__Vector_base<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<std::array<unsigned_char,7ul>,std::allocator<std::array<unsigned_char,7ul>>>
                ::_M_realloc_insert<std::array<unsigned_char,7ul>const&>
                          ((vector<std::array<unsigned_char,7ul>,std::allocator<std::array<unsigned_char,7ul>>>
                            *)&local_78,
                           (iterator)
                           local_78.
                           super__Vector_base<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_80);
              }
              else {
                local_80._M_elems[3] = local_88._M_elems[3];
                *(uint *)((local_78.
                           super__Vector_base<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->_M_elems + 3) =
                     CONCAT13(local_88._M_elems[6],
                              CONCAT21(local_88._M_elems._4_2_,local_80._M_elems[3]));
                *(undefined4 *)
                 (local_78.
                  super__Vector_base<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->_M_elems = local_88._M_elems._0_4_;
                local_78.
                super__Vector_base<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_78.
                     super__Vector_base<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
                local_80._M_elems._0_4_ = uVar1;
              }
            }
          }
          uVar6 = uVar6 + 1;
          lVar5 = lVar5 + 0x510;
        } while (uVar6 < (ulong)(((long)local_58.
                                        super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_58.
                                        super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>.
                                        _M_impl.super__Vector_impl_data._M_start >> 4) *
                                0x2c3f35ba781948b1));
      }
      bVar7 = uVar4 == 0;
      uVar4 = uVar4 + 1;
    } while (bVar7);
    bVar7 = local_78.
            super__Vector_base<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_78.
            super__Vector_base<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    this = local_40;
    __return_storage_ptr__ = local_38;
  }
  else {
    bVar7 = false;
  }
  if ((_Type)local_58.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.
             super__Vector_impl_data._M_start != (_Type)0x0) {
    operator_delete(local_58.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  (__return_storage_ptr__->
  super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (bVar7) {
    std::
    vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
    ::reserve(__return_storage_ptr__,
              ((long)local_78.
                     super__Vector_base<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_78.
                    super__Vector_base<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) * 0x6db6db6db6db6db7);
    paVar2 = local_78.
             super__Vector_base<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_78.
        super__Vector_base<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_78.
        super__Vector_base<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      data_00 = local_78.
                super__Vector_base<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        HwIdentifier::HwIdentifier((HwIdentifier *)&local_58);
        strategy = (*(this->super_IdentificationStrategy)._vptr_IdentificationStrategy[2])(this);
        HwIdentifier::set_identification_strategy((HwIdentifier *)&local_58,strategy);
        HwIdentifier::set_data((HwIdentifier *)&local_58,data_00);
        std::
        vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
        ::push_back(__return_storage_ptr__,(HwIdentifier *)&local_58);
        HwIdentifier::~HwIdentifier((HwIdentifier *)&local_58);
        data_00 = data_00 + 1;
      } while (data_00 != paVar2);
    }
  }
  if (local_78.
      super__Vector_base<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (array<unsigned_char,_7UL> *)0x0) {
    operator_delete(local_78.
                    super__Vector_base<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<HwIdentifier> DiskStrategy::alternative_ids() const {
	vector<array<uint8_t, HW_IDENTIFIER_PROPRIETARY_DATA>> data;
	FUNCTION_RETURN result = generate_disk_pc_id(data);
	vector<HwIdentifier> identifiers;
	if (result == FUNC_RET_OK) {
		identifiers.reserve(data.size());
		for (auto &it : data) {
			HwIdentifier pc_id;
			pc_id.set_identification_strategy(identification_strategy());
			pc_id.set_data(it);
			identifiers.push_back(pc_id);
		}
	}
	return identifiers;
}